

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_NtkFindNamesInPlaces(char *pBuffer,Vec_Int_t *vPlaces,Vec_Ptr_t *vPivots)

{
  uint uVar1;
  char *__needle;
  int iVar2;
  int iVar3;
  int *piVar4;
  Vec_Ptr_t *vNames;
  void **ppvVar5;
  char *pcVar6;
  char *__s1;
  size_t sVar7;
  char *__dest;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  char pLocal [1000];
  char local_418 [1000];
  
  piVar4 = Abc_FrameReadGateCounts();
  vNames = (Vec_Ptr_t *)malloc(0x10);
  vNames->nCap = 100;
  vNames->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vNames->pArray = ppvVar5;
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  piVar4[4] = 0;
  if (1 < vPlaces->nSize) {
    lVar9 = 0;
    do {
      iVar3 = vPlaces->pArray[lVar9 + 1];
      if (((long)iVar3 < 0) || (vPivots->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = vPlaces->pArray[lVar9];
      __needle = (char *)vPivots->pArray[iVar3];
      lVar8 = 0;
      while (pBuffer[lVar8 + iVar2] != '\n') {
        local_418[lVar8] = pBuffer[lVar8 + iVar2];
        lVar8 = lVar8 + 1;
        if (lVar8 == 1000) {
          __assert_fail("k < 1000",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                        ,0x3c6,"void Acb_NtkFindNamesInPlaces(char *, Vec_Int_t *, Vec_Ptr_t *)");
        }
      }
      local_418[lVar8] = '\0';
      pcVar6 = strstr(local_418,__needle);
      if (pcVar6 == (char *)0x0) {
        printf("Cannot find location of signal \"%s\" in this line.\n",__needle);
      }
      else {
        __s1 = strtok(local_418," \r\n\t,;()");
        if (__s1 == (char *)0x0) {
          iVar3 = 0;
        }
        else {
          iVar3 = 0;
          do {
            iVar2 = strcmp(__s1,"1\'b0");
            if (iVar2 == 0) {
              *piVar4 = *piVar4 + 1;
            }
            else {
              iVar2 = strcmp(__s1,"1\'b1");
              if (iVar2 == 0) {
                piVar4[1] = piVar4[1] + 1;
              }
              else {
                iVar2 = strcmp(__s1,"buf");
                if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"assign"), iVar2 == 0)) {
                  piVar4[2] = piVar4[2] + 1;
                }
                else {
                  iVar2 = strcmp(__s1,"not");
                  if (iVar2 == 0) {
                    piVar4[3] = piVar4[3] + 1;
                  }
                  else {
                    iVar2 = strcmp(__s1,__needle);
                    if ((pcVar6 < __s1) && (iVar2 != 0)) {
                      uVar1 = vNames->nSize;
                      if ((int)uVar1 < 1) {
                        uVar10 = 0;
                      }
                      else {
                        ppvVar5 = vNames->pArray;
                        uVar11 = 0;
                        do {
                          iVar2 = strcmp((char *)ppvVar5[uVar11],__s1);
                          if (iVar2 == 0) goto LAB_003b0149;
                          uVar11 = uVar11 + 1;
                        } while (uVar1 != uVar11);
                        uVar11 = (ulong)uVar1;
LAB_003b0149:
                        uVar10 = (uint)uVar11;
                      }
                      iVar3 = iVar3 + 1;
                      if (uVar10 == uVar1) {
                        sVar7 = strlen(__s1);
                        __dest = (char *)malloc(sVar7 + 1);
                        strcpy(__dest,__s1);
                        uVar10 = vNames->nCap;
                        if (uVar1 == uVar10) {
                          if ((int)uVar10 < 0x10) {
                            if (vNames->pArray == (void **)0x0) {
                              ppvVar5 = (void **)malloc(0x80);
                            }
                            else {
                              ppvVar5 = (void **)realloc(vNames->pArray,0x80);
                            }
                            iVar2 = 0x10;
                          }
                          else {
                            iVar2 = uVar10 * 2;
                            if (iVar2 <= (int)uVar10) goto LAB_003b022d;
                            if (vNames->pArray == (void **)0x0) {
                              ppvVar5 = (void **)malloc((ulong)uVar10 << 4);
                            }
                            else {
                              ppvVar5 = (void **)realloc(vNames->pArray,(ulong)uVar10 << 4);
                            }
                          }
                          vNames->pArray = ppvVar5;
                          vNames->nCap = iVar2;
                        }
LAB_003b022d:
                        iVar2 = vNames->nSize;
                        vNames->nSize = iVar2 + 1;
                        vNames->pArray[iVar2] = __dest;
                      }
                    }
                  }
                }
              }
            }
            __s1 = strtok((char *)0x0," \r\n\t,;()");
          } while (__s1 != (char *)0x0);
        }
        if (1 < iVar3) {
          piVar4[4] = piVar4[4] + iVar3 + -1;
        }
      }
      lVar9 = lVar9 + 2;
    } while ((int)((uint)lVar9 | 1) < vPlaces->nSize);
  }
  Abc_FrameSetSignalNames(vNames);
  return;
}

Assistant:

void Acb_NtkFindNamesInPlaces( char * pBuffer, Vec_Int_t * vPlaces, Vec_Ptr_t * vPivots )
{
    int * pCounts = Abc_FrameReadGateCounts();
    Vec_Ptr_t * vNames = Vec_PtrAlloc( 100 );
    int i, k, iObj, Pos;
    for ( i = 0; i < 5; i++ )
        pCounts[i] = 0;
    Vec_IntForEachEntryDouble( vPlaces, Pos, iObj, i )
    {
        int nFanins = 0;
        char pLocal[1000], * pTemp, * pName, * pSpot;
        char * pPivot = (char *)Vec_PtrEntry(vPivots, iObj);
        for ( k = 0; k < 1000; k++ )
        {
            if ( pBuffer[Pos+k] == '\n' )
            {
                pLocal[k] = 0;
                break;
            }
            else
                pLocal[k] = pBuffer[Pos+k];
        }
        assert( k < 1000 );
        pSpot = strstr( pLocal, pPivot );
        if ( pSpot == NULL )
        {
            printf( "Cannot find location of signal \"%s\" in this line.\n", pPivot );
            continue;
        }
        pTemp = strtok( pLocal, " \r\n\t,;()" );
        while ( pTemp )
        {
            if ( !strcmp(pTemp, "1\'b0") )
                pCounts[0]++;
            else if ( !strcmp(pTemp, "1\'b1") )
                pCounts[1]++;
            else if ( !strcmp(pTemp, "buf") || !strcmp(pTemp, "assign") )
                pCounts[2]++;
            else if ( !strcmp(pTemp, "not") )
                pCounts[3]++;
            else if ( strcmp(pTemp, pPivot) && pTemp > pSpot )
            {
                nFanins++;
                Vec_PtrForEachEntry( char *, vNames, pName, k )
                    if ( !strcmp(pName, pTemp) )
                        break;
                if ( k == Vec_PtrSize(vNames) )
                    Vec_PtrPush( vNames, Abc_UtilStrsav(pTemp) );
            }
            pTemp = strtok( NULL, " \r\n\t,;()" );
        }
        if ( nFanins > 1 )
            pCounts[4] += nFanins-1;
    }
    //printf( "Found %d names\n", Vec_PtrSize(vNames) );
    Abc_FrameSetSignalNames( vNames );
}